

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * formatCodePoint_abi_cxx11_(string *__return_storage_ptr__,ThreadId threadId)

{
  pointer pFVar1;
  bool bVar2;
  element_type *peVar3;
  reference pvVar4;
  undefined1 local_c8 [8];
  FrameState vf;
  allocator local_39;
  undefined1 local_38 [8];
  ThreadState vt;
  ThreadId threadId_local;
  
  vt.frameIds.
  super__Vector_base<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)threadId;
  peVar3 = std::
           __shared_ptr_access<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&debugger);
  (*peVar3->_vptr_IDebugger[0xc])
            (local_38,peVar3,
             vt.frameIds.
             super__Vector_base<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = std::vector<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>::empty
                    ((vector<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>
                      *)&vt);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"@unknown",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    vf.scopeIds.
    super__Vector_base<chatra::debugger::ScopeId,_std::allocator<chatra::debugger::ScopeId>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    peVar3 = std::
             __shared_ptr_access<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&debugger);
    pFVar1 = vt.frameIds.
             super__Vector_base<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar4 = std::vector<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>::
             front((vector<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_> *)
                   &vt);
    (*peVar3->_vptr_IDebugger[0xd])(local_c8,peVar3,pFVar1,*pvVar4);
    formatCodePoint_abi_cxx11_(__return_storage_ptr__,(CodePoint *)&vf.frameType);
    vf.scopeIds.
    super__Vector_base<chatra::debugger::ScopeId,_std::allocator<chatra::debugger::ScopeId>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    chatra::debugger::FrameState::~FrameState((FrameState *)local_c8);
  }
  chatra::debugger::ThreadState::~ThreadState((ThreadState *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatCodePoint(cha::d::ThreadId threadId) {
	auto vt = debugger->getThreadState(threadId);
	if (vt.frameIds.empty())
		return "@unknown";

	auto vf = debugger->getFrameState(threadId, vt.frameIds.front());
	return formatCodePoint(vf.current);
}